

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiArea::removeSubWindow(QMdiArea *this,QWidget *widget)

{
  QMdiAreaPrivate *this_00;
  Data *pDVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  bool bVar4;
  qsizetype qVar5;
  QWidget *pQVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  QMdiSubWindow *child_00;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  int index;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_78;
  int local_5c;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    pcVar8 = "QMdiArea::removeSubWindow: null pointer to widget";
  }
  else {
    this_00 = *(QMdiAreaPrivate **)
               &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
    if ((this_00->childWindows).d.size == 0) goto LAB_0040e781;
    local_78.d = (Data *)QtPrivate::qobject_cast_helper<QMdiSubWindow*,QObject>
                                   (&widget->super_QObject);
    if ((QWidget *)local_78.d == (QWidget *)0x0) {
      local_78.d = (this_00->childWindows).d.d;
      pQVar2 = (this_00->childWindows).d.ptr;
      local_78.size = (this_00->childWindows).d.size;
      if ((QWidget *)local_78.d != (QWidget *)0x0) {
        LOCK();
        *(int *)local_78.d = *(int *)local_78.d + 1;
        UNLOCK();
      }
      lVar9 = local_78.size * 0x10;
      local_78.ptr = pQVar2;
      for (lVar7 = 0; lVar9 != lVar7; lVar7 = lVar7 + 0x10) {
        lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar7);
        if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
          child_00 = (QMdiSubWindow *)0x0;
        }
        else {
          child_00 = *(QMdiSubWindow **)((long)&(pQVar2->wp).value + lVar7);
        }
        bVar4 = sanityCheck(child_00,"QMdiArea::removeSubWindow");
        if (bVar4) {
          pQVar6 = QMdiSubWindow::widget(child_00);
          if (pQVar6 == widget) {
            QMdiSubWindow::setWidget(child_00,(QWidget *)0x0);
            goto LAB_0040e779;
          }
        }
      }
      local_58[0] = '\x02';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_40 = "default";
      QMessageLogger::warning
                (local_58,
                 "QMdiArea::removeSubWindow: widget is not child of any window inside QMdiArea");
LAB_0040e779:
      QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_78);
      goto LAB_0040e781;
    }
    qVar5 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                      (&this_00->childWindows,(QMdiSubWindow **)&local_78,0);
    local_5c = (int)qVar5;
    if (local_5c != -1) {
      QMdiAreaPrivate::disconnectSubWindow(this_00,(QObject *)local_78.d);
      QtPrivate::sequential_erase_with_copy<QList<QPointer<QMdiSubWindow>>,QMdiSubWindow*>
                (&this_00->childWindows,(QMdiSubWindow **)&local_78);
      QtPrivate::sequential_erase_with_copy<QList<int>,int>
                (&this_00->indicesToActivatedChildren,&local_5c);
      pDVar1 = (this_00->active).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar6 = (QWidget *)0x0;
      }
      else {
        pQVar6 = (QWidget *)(this_00->active).wp.value;
      }
      QMdiAreaPrivate::updateActiveWindow(this_00,local_5c,pQVar6 == (QWidget *)local_78.d);
      QWidget::setParent((QWidget *)local_78.d,(QWidget *)0x0);
      goto LAB_0040e781;
    }
    pcVar8 = "QMdiArea::removeSubWindow: window is not inside workspace";
  }
  local_40 = "default";
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0] = '\x02';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  QMessageLogger::warning(local_58,pcVar8);
LAB_0040e781:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiArea::removeSubWindow(QWidget *widget)
{
    if (Q_UNLIKELY(!widget)) {
        qWarning("QMdiArea::removeSubWindow: null pointer to widget");
        return;
    }

    Q_D(QMdiArea);
    if (d->childWindows.isEmpty())
        return;

    if (QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(widget)) {
        int index = d->childWindows.indexOf(child);
        if (Q_UNLIKELY(index == -1)) {
            qWarning("QMdiArea::removeSubWindow: window is not inside workspace");
            return;
        }
        d->disconnectSubWindow(child);
        d->childWindows.removeAll(child);
        d->indicesToActivatedChildren.removeAll(index);
        d->updateActiveWindow(index, d->active == child);
        child->setParent(nullptr);
        return;
    }

    bool found = false;
    // Take a copy because child->setWidget(nullptr) will indirectly
    // QCoreApplication::sendEvent(); the latter could call unknown code that could
    // e.g. recurse into the class modifying d->childWindows.
    const auto subWindows = d->childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::removeSubWindow"))
            continue;
        if (child->widget() == widget) {
            child->setWidget(nullptr);
            Q_ASSERT(!child->widget());
            found = true;
            break;
        }
    }

    if (Q_UNLIKELY(!found))
        qWarning("QMdiArea::removeSubWindow: widget is not child of any window inside QMdiArea");
}